

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tableref.cpp
# Opt level: O1

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::BaseTableRef::Deserialize(BaseTableRef *this,Deserializer *deserializer)

{
  _Tuple_impl<0UL,_duckdb::AtClause_*,_std::default_delete<duckdb::AtClause>_> _Var1;
  _Tuple_impl<0UL,_duckdb::AtClause_*,_std::default_delete<duckdb::AtClause>_> _Var2;
  uint uVar3;
  int iVar4;
  BaseTableRef *this_00;
  pointer pBVar5;
  _Head_base<0UL,_duckdb::AtClause_*,_false> __ptr;
  default_delete<duckdb::AtClause> *this_01;
  unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>,_true> *this_02;
  unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true> result;
  _Head_base<0UL,_duckdb::BaseTableRef_*,_false> local_60;
  _Tuple_impl<0UL,_duckdb::AtClause_*,_std::default_delete<duckdb::AtClause>_> local_58;
  _Head_base<0UL,_duckdb::AtClause_*,_false> local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this_00 = (BaseTableRef *)operator_new(0xd0);
  BaseTableRef(this_00);
  local_60._M_head_impl = this_00;
  pBVar5 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                       *)&local_60);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"schema_name");
  if ((char)uVar3 == '\0') {
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_50._M_head_impl = (AtClause *)&local_40;
    ::std::__cxx11::string::operator=((string *)&pBVar5->schema_name,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_head_impl != &local_40) goto LAB_01781c81;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pBVar5->schema_name,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_head_impl != &local_40) {
LAB_01781c81:
      operator_delete(local_50._M_head_impl);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  pBVar5 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                       *)&local_60);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"table_name");
  if ((char)uVar3 == '\0') {
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_50._M_head_impl = (AtClause *)&local_40;
    ::std::__cxx11::string::operator=((string *)&pBVar5->table_name,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_head_impl != &local_40) goto LAB_01781d22;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pBVar5->table_name,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_head_impl != &local_40) {
LAB_01781d22:
      operator_delete(local_50._M_head_impl);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  pBVar5 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                       *)&local_60);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,0xca,"column_name_alias",&(pBVar5->super_TableRef).column_name_alias);
  pBVar5 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                       *)&local_60);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcb,"catalog_name");
  if ((char)uVar3 == '\0') {
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_50._M_head_impl = (AtClause *)&local_40;
    ::std::__cxx11::string::operator=((string *)&pBVar5->catalog_name,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_head_impl != &local_40) goto LAB_01781de5;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pBVar5->catalog_name,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_head_impl != &local_40) {
LAB_01781de5:
      operator_delete(local_50._M_head_impl);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  pBVar5 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                       *)&local_60);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcc,"at_clause");
  this_02 = &pBVar5->at_clause;
  if ((char)uVar3 == '\0') {
    local_50._M_head_impl = (AtClause *)0x0;
    _Var1.super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl =
         (this_02->super_unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>)._M_t.
         super___uniq_ptr_impl<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::AtClause_*,_std::default_delete<duckdb::AtClause>_>.
         super__Head_base<0UL,_duckdb::AtClause_*,_false>;
    (this_02->super_unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>)._M_t.
    super___uniq_ptr_impl<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::AtClause_*,_std::default_delete<duckdb::AtClause>_>.
    super__Head_base<0UL,_duckdb::AtClause_*,_false> =
         (_Head_base<0UL,_duckdb::AtClause_*,_false>)0x0;
    if (_Var1.super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl != (AtClause *)0x0) {
      ::std::default_delete<duckdb::AtClause>::operator()
                ((default_delete<duckdb::AtClause> *)this_02,
                 (AtClause *)_Var1.super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_head_impl ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_01781ece;
    this_01 = (default_delete<duckdb::AtClause> *)&local_50;
    __ptr._M_head_impl = local_50._M_head_impl;
  }
  else {
    local_58.super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::AtClause_*,_false>)(AtClause *)0x0;
    iVar4 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar4 != '\0') {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      AtClause::Deserialize((AtClause *)&local_50,deserializer);
      local_58.super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl =
           (_Head_base<0UL,_duckdb::AtClause_*,_false>)
           (_Head_base<0UL,_duckdb::AtClause_*,_false>)local_50._M_head_impl;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var2.super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl =
         local_58.super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl;
    local_58.super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::AtClause_*,_false>)(AtClause *)0x0;
    _Var1.super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl =
         (this_02->super_unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>)._M_t.
         super___uniq_ptr_impl<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::AtClause_*,_std::default_delete<duckdb::AtClause>_>.
         super__Head_base<0UL,_duckdb::AtClause_*,_false>;
    (this_02->super_unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>)._M_t.
    super___uniq_ptr_impl<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::AtClause_*,_std::default_delete<duckdb::AtClause>_>.
    super__Head_base<0UL,_duckdb::AtClause_*,_false> =
         _Var2.super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl;
    if (_Var1.super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl != (AtClause *)0x0) {
      ::std::default_delete<duckdb::AtClause>::operator()
                ((default_delete<duckdb::AtClause> *)this_02,
                 (AtClause *)_Var1.super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl);
    }
    if (local_58.super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl == (AtClause *)0x0)
    goto LAB_01781ece;
    this_01 = (default_delete<duckdb::AtClause> *)&local_58;
    __ptr = local_58.super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl;
  }
  ::std::default_delete<duckdb::AtClause>::operator()(this_01,__ptr._M_head_impl);
LAB_01781ece:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  (this->super_TableRef)._vptr_TableRef = (_func_int **)local_60._M_head_impl;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> BaseTableRef::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<BaseTableRef>(new BaseTableRef());
	deserializer.ReadPropertyWithDefault<string>(200, "schema_name", result->schema_name);
	deserializer.ReadPropertyWithDefault<string>(201, "table_name", result->table_name);
	deserializer.ReadPropertyWithDefault<vector<string>>(202, "column_name_alias", result->column_name_alias);
	deserializer.ReadPropertyWithDefault<string>(203, "catalog_name", result->catalog_name);
	deserializer.ReadPropertyWithDefault<unique_ptr<AtClause>>(204, "at_clause", result->at_clause);
	return std::move(result);
}